

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O3

bool __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::resize(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
         *this,size_t worker_count)

{
  int iVar1;
  bool bVar2;
  thread_resource_error anon_var_0;
  shared_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  asStack_68 [4];
  
  do {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_monitor);
  } while (iVar1 == 4);
  if (this->m_terminate_all_workers == false) {
    this->m_target_worker_count = worker_count;
    if (this->m_target_worker_count < this->m_worker_count) {
      condition_variable_any::notify_all(&this->m_task_or_terminate_workers_event);
      bVar2 = true;
    }
    else {
      bVar2 = true;
      if (this->m_worker_count < this->m_target_worker_count) {
        do {
          shared_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>
          ::
          shared_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>
                    ((shared_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>
                      *)asStack_68,
                     (weak_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
                      *)this);
          worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
          ::create_and_attach(asStack_68);
          boost::detail::shared_count::~shared_count(&asStack_68[0].pn);
          this->m_worker_count = this->m_worker_count + 1;
          this->m_active_worker_count = this->m_active_worker_count + 1;
        } while (this->m_worker_count < this->m_target_worker_count);
      }
    }
  }
  else {
    bVar2 = false;
  }
  do {
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_monitor);
  } while (iVar1 == 4);
  return bVar2;
}

Assistant:

bool resize(size_t const worker_count) volatile
    {
      locking_ptr<pool_type, recursive_mutex> lockedThis(*this, m_monitor); 

      if(!m_terminate_all_workers)
      {
        m_target_worker_count = worker_count;
      }
      else
      { 
        return false;
      }


      if(m_worker_count <= m_target_worker_count)
      { // increase worker count
        while(m_worker_count < m_target_worker_count)
        {
          try
          {
            worker_thread<pool_type>::create_and_attach(lockedThis->shared_from_this());
            m_worker_count++;
            m_active_worker_count++;	
          }
          catch(thread_resource_error)
          {
            return false;
          }
        }
      }
      else
      { // decrease worker count
        lockedThis->m_task_or_terminate_workers_event.notify_all();   // TODO: Optimize number of notified workers
      }

      return true;
    }